

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_cast.cpp
# Opt level: O2

BoundCastInfo *
duckdb::DefaultCasts::MapCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  pointer *__ptr;
  undefined1 local_88 [24];
  LogicalType local_70;
  LogicalType local_58;
  LogicalType varchar_type;
  
  if (target->id_ == VARCHAR) {
    LogicalType::LogicalType(&local_58,VARCHAR);
    LogicalType::LogicalType(&local_70,VARCHAR);
    LogicalType::MAP(&varchar_type,&local_58,&local_70);
    LogicalType::~LogicalType(&local_70);
    LogicalType::~LogicalType(&local_58);
    ListBoundCastData::BindListToListCast((ListBoundCastData *)local_88,input,source,&varchar_type);
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,MapToVarcharCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)local_88,ListBoundCastData::InitListLocalState);
    if ((_func_int **)local_88._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_88._0_8_ + 8))();
    }
    local_88._0_8_ = (_func_int **)0x0;
    LogicalType::~LogicalType(&varchar_type);
  }
  else {
    if (target->id_ == MAP) {
      ListBoundCastData::BindListToListCast
                ((ListBoundCastData *)(local_88 + 0x10),input,source,target);
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,ListCast::ListToListCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)(local_88 + 0x10),ListBoundCastData::InitListLocalState);
    }
    else {
      local_88._8_8_ = (cast_function_t)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,TryVectorNullCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)(local_88 + 8),(init_cast_local_state_t)0x0);
      local_88._16_8_ = local_88._8_8_;
    }
    if ((cast_function_t)local_88._16_8_ != (cast_function_t)0x0) {
      (**(code **)(*(long *)local_88._16_8_ + 8))();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::MapCastSwitch(BindCastInput &input, const LogicalType &source, const LogicalType &target) {
	switch (target.id()) {
	case LogicalTypeId::MAP:
		return BoundCastInfo(ListCast::ListToListCast, ListBoundCastData::BindListToListCast(input, source, target),
		                     ListBoundCastData::InitListLocalState);
	case LogicalTypeId::VARCHAR: {
		auto varchar_type = LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR);
		return BoundCastInfo(MapToVarcharCast, ListBoundCastData::BindListToListCast(input, source, varchar_type),
		                     ListBoundCastData::InitListLocalState);
	}
	default:
		return TryVectorNullCast;
	}
}